

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseContainer.cpp
# Opt level: O0

void __thiscall
Saturation::ActiveClauseContainer::onLimitsUpdated
          (ActiveClauseContainer *this,PassiveClauseContainer *limits)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  Clause *pCVar5;
  Clause *in_RSI;
  long *in_RDI;
  Clause *removed;
  Clause *cl;
  IterTraits<Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator> rit;
  Elem in_stack_ffffffffffffffb0;
  Stack<Kernel::Clause_*> *in_stack_ffffffffffffffc0;
  
  uVar4 = (**(code **)(*(long *)&in_RSI->super_Unit + 0x68))();
  if ((uVar4 & 1) != 0) {
    if ((onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove == '\0') &&
       (iVar2 = __cxa_guard_acquire(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove)
       , iVar2 != 0)) {
      Lib::Stack<Kernel::Clause_*>::Stack(in_stack_ffffffffffffffc0,(size_t)in_RDI);
      __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&onLimitsUpdated::toRemove,&__dso_handle);
      __cxa_guard_release(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove);
    }
    Lib::Stack<Kernel::Clause_*>::reset(&onLimitsUpdated::toRemove);
    Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::iter
              ((Set<Kernel::Clause_*,_Lib::DefaultHash> *)in_stack_ffffffffffffffb0);
    while (bVar1 = Lib::IterTraits<Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator>::hasNext
                             ((IterTraits<Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator> *)
                              0xac1bed), bVar1) {
      in_stack_ffffffffffffffb0 =
           Lib::IterTraits<Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator>::next
                     ((IterTraits<Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator> *)
                      in_stack_ffffffffffffffb0);
      pCVar5 = in_RSI;
      uVar3 = Kernel::Clause::numSelected(in_stack_ffffffffffffffb0);
      uVar4 = (**(code **)(*(long *)&pCVar5->super_Unit + 0x70))
                        (pCVar5,in_stack_ffffffffffffffb0,uVar3);
      if ((uVar4 & 1) != 0) {
        Lib::Stack<Kernel::Clause_*>::push
                  ((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffffb0,pCVar5);
      }
    }
    while (bVar1 = Lib::Stack<Kernel::Clause_*>::isNonEmpty(&onLimitsUpdated::toRemove), bVar1) {
      pCVar5 = Lib::Stack<Kernel::Clause_*>::pop(&onLimitsUpdated::toRemove);
      *(int *)(DAT_01333840 + 0x1e4) = *(int *)(DAT_01333840 + 0x1e4) + 1;
      (**(code **)(*in_RDI + 0x20))(in_RDI,pCVar5);
    }
  }
  return;
}

Assistant:

void ActiveClauseContainer::onLimitsUpdated(PassiveClauseContainer* limits)
{
  ASS(limits);
  if (!limits->mayBeAbleToDiscriminateChildrenOnLimits()) {
    return;
  }

  static Stack<Clause*> toRemove(64);
  toRemove.reset();

  auto rit = _clauses.iter();
  while (rit.hasNext()) {
    Clause* cl=rit.next();
    ASS(cl);

    if (limits->allChildrenNecessarilyExceedLimits(cl, cl->numSelected()))
    {
      ASS(cl->store()==Clause::ACTIVE);
      toRemove.push(cl);
    }
  }

#if OUTPUT_LRS_DETAILS
  if (toRemove.isNonEmpty()) {
    cout<<toRemove.size()<<" active deleted\n";
  }
#endif

  while (toRemove.isNonEmpty()) {
    Clause* removed=toRemove.pop();
    ASS(removed->store()==Clause::ACTIVE);

    RSTAT_CTR_INC("clauses discarded from active on limit update");
    env.statistics->discardedNonRedundantClauses++;

    remove(removed);
    // ASS_NEQ(removed->store(), Clause::ACTIVE); -- the remove could have deleted the clause - do not touch!
  }
}